

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction.cpp
# Opt level: O1

void __thiscall
duckdb::DuckTransaction::PushDelete
          (DuckTransaction *this,DataTable *table,RowVersionManager *info,idx_t vector_idx,
          row_t *rows,idx_t count,idx_t base_row)

{
  ulong uVar1;
  data_ptr_t pdVar2;
  long lVar3;
  unsigned_short uVar4;
  uint16_t *puVar5;
  idx_t iVar6;
  ulong uVar7;
  bool bVar8;
  UndoBufferReference undo_entry;
  UndoBufferReference local_58;
  
  ModifyTable(this,table);
  iVar6 = 0x30;
  bVar8 = count == 0;
  if (!bVar8) {
    if (*rows == 0) {
      uVar7 = 0;
      do {
        if (count - 1 == uVar7) {
          bVar8 = true;
          goto LAB_0180d74d;
        }
        uVar1 = uVar7 + 1;
        lVar3 = uVar7 + 1;
        uVar7 = uVar1;
      } while (uVar1 == rows[lVar3]);
      bVar8 = count <= uVar1;
    }
    iVar6 = count * 2 + 0x30;
  }
LAB_0180d74d:
  UndoBuffer::CreateEntry(&local_58,&this->undo_buffer,DELETE_TUPLE,iVar6);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_58.handle.node);
  pdVar2 = (local_58.handle.node.ptr)->buffer;
  *(RowVersionManager **)(pdVar2 + local_58.position + 8) = info;
  *(idx_t *)(pdVar2 + local_58.position + 0x10) = vector_idx;
  *(DataTable **)(pdVar2 + local_58.position) = table;
  *(idx_t *)(pdVar2 + local_58.position + 0x18) = count;
  *(idx_t *)(pdVar2 + local_58.position + 0x20) = base_row;
  pdVar2[local_58.position + 0x28] = bVar8;
  if (bVar8 == false) {
    puVar5 = DeleteInfo::GetRows((DeleteInfo *)(pdVar2 + local_58.position));
    if (count != 0) {
      iVar6 = 0;
      do {
        uVar4 = NumericCastImpl<unsigned_short,_long,_false>::Convert(rows[iVar6]);
        puVar5[iVar6] = uVar4;
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
    }
  }
  BufferHandle::~BufferHandle(&local_58.handle);
  return;
}

Assistant:

void DuckTransaction::PushDelete(DataTable &table, RowVersionManager &info, idx_t vector_idx, row_t rows[], idx_t count,
                                 idx_t base_row) {
	ModifyTable(table);
	bool is_consecutive = true;
	// check if the rows are consecutive
	for (idx_t i = 0; i < count; i++) {
		if (rows[i] != row_t(i)) {
			is_consecutive = false;
			break;
		}
	}
	idx_t alloc_size = sizeof(DeleteInfo);
	if (!is_consecutive) {
		// if rows are not consecutive we need to allocate row identifiers
		alloc_size += sizeof(uint16_t) * count;
	}

	auto undo_entry = undo_buffer.CreateEntry(UndoFlags::DELETE_TUPLE, alloc_size);
	auto delete_info = reinterpret_cast<DeleteInfo *>(undo_entry.Ptr());
	delete_info->version_info = &info;
	delete_info->vector_idx = vector_idx;
	delete_info->table = &table;
	delete_info->count = count;
	delete_info->base_row = base_row;
	delete_info->is_consecutive = is_consecutive;
	if (!is_consecutive) {
		// if rows are not consecutive
		auto delete_rows = delete_info->GetRows();
		for (idx_t i = 0; i < count; i++) {
			delete_rows[i] = NumericCast<uint16_t>(rows[i]);
		}
	}
}